

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPPVIndexValuePair.cpp
# Opt level: O2

string * __thiscall
JPPVIndexValuePair::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,JPPVIndexValuePair *this)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::operator<<(local_198,"JPPVIndexValuePair: value=");
  (*(this->super_JointPolicyValuePair).super_PolicyPoolItemInterface._vptr_PolicyPoolItemInterface
    [3])(this);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::operator<<(poVar1,", jpolIndex:");
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

string JPPVIndexValuePair::SoftPrint() const
{
    stringstream ss;
    ss << "JPPVIndexValuePair: value="<< GetValue() <<", jpolIndex:"; 
    ss << _m_jpolIndex;
    return(ss.str());
}